

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O0

void __thiscall FArchive::WriteCount(FArchive *this,DWORD count)

{
  byte local_15;
  uint local_14;
  BYTE out;
  FArchive *pFStack_10;
  DWORD count_local;
  FArchive *this_local;
  
  local_14 = count;
  pFStack_10 = this;
  do {
    local_15 = (byte)local_14 & 0x7f;
    if (0x7f < local_14) {
      local_15 = local_15 | 0x80;
    }
    (*this->_vptr_FArchive[2])(this,&local_15,1);
    local_14 = local_14 >> 7;
  } while (local_14 != 0);
  return;
}

Assistant:

void FArchive::WriteCount (DWORD count)
{
	BYTE out;

	do
	{
		out = count & 0x7f;
		if (count >= 0x80)
			out |= 0x80;
		Write (&out, sizeof(BYTE));
		count >>= 7;
	} while (count);

}